

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O3

void TPZSkylMatrix<std::complex<double>_>::InitializeElem
               (TPZVec<long> *skyline,TPZVec<std::complex<double>_> *storage,
               TPZVec<std::complex<double>_*> *point)

{
  long *plVar1;
  undefined8 *puVar2;
  long lVar3;
  complex<double> *pcVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  int64_t dim;
  
  lVar3 = skyline->fNElements;
  if (lVar3 < 1) {
    lVar5 = 0;
  }
  else {
    lVar5 = 0;
    lVar7 = 0;
    do {
      lVar6 = lVar7;
      plVar1 = skyline->fStore + lVar5;
      lVar7 = lVar6 + lVar5;
      lVar5 = lVar5 + 1;
      lVar7 = (lVar7 + 1) - *plVar1;
    } while (lVar3 != lVar5);
    lVar5 = (lVar6 - *plVar1) + lVar5;
  }
  (*storage->_vptr_TPZVec[3])(storage,lVar5);
  lVar7 = storage->fNElements;
  if (0 < lVar7) {
    lVar6 = 0;
    do {
      puVar2 = (undefined8 *)(storage->fStore->_M_value + lVar6);
      *puVar2 = 0;
      puVar2[1] = 0;
      lVar6 = lVar6 + 0x10;
      lVar7 = lVar7 + -1;
    } while (lVar7 != 0);
  }
  (*point->_vptr_TPZVec[3])(point,lVar3 + 1);
  if (lVar3 == 0) {
    *point->fStore = (complex<double> *)0x0;
  }
  else {
    pcVar4 = storage->fStore;
    *point->fStore = pcVar4;
    point->fStore[lVar3] = pcVar4 + lVar5;
    if (0 < lVar3) {
      lVar5 = 0x10;
      lVar7 = 0;
      do {
        point->fStore[lVar7 + 1] =
             (complex<double> *)(point->fStore[lVar7][-skyline->fStore[lVar7]]._M_value + lVar5);
        lVar7 = lVar7 + 1;
        lVar5 = lVar5 + 0x10;
      } while (lVar3 != lVar7);
    }
  }
  return;
}

Assistant:

void TPZSkylMatrix<TVar>::InitializeElem(const TPZVec<int64_t> &skyline, TPZVec<TVar> &storage, TPZVec<TVar *> &point) {   // JORGE 2013 OUTUBRO ???
	int64_t dim = skyline.NElements();
	int64_t nel = NumElements(skyline);
#ifdef PZDEBUG
    //	std::cout << "Skyline Matrix, Number of elements : " << nel << " in floating point " << nel*sizeof(TVar) << std::endl;
#endif
	storage.Resize(nel);
	storage.Fill(0.);
	int64_t i;
	point.Resize(dim+1);
	if(dim) {
		point[0] = &storage[0];
		point[dim] = &storage[0]+nel;
	} else {
		point[0] = 0;
	}
	for(i=1; i<dim+1; i++)
		point[i] = point[i-1]+(i-1)-skyline[i-1]+1;
}